

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

void __thiscall GB::jr_cc_n(GB *this,u8 mask,u8 val)

{
  long lVar1;
  u8 uVar2;
  bool bVar3;
  u8 val_local;
  u8 mask_local;
  GB *this_local;
  
  lVar1 = (this->s).op_tick;
  if (lVar1 == 0xe) {
    uVar2 = read_n(this);
    (this->s).field_6.field_0.z = uVar2;
    bVar3 = f_is(this,mask,val);
    if (bVar3) {
      (this->s).pc = (this->s).pc + (short)(char)(this->s).field_6.field_0.z;
    }
  }
  else if (lVar1 == 0x16) {
    op_done(this);
  }
  return;
}

Assistant:

void GB::jr_cc_n(u8 mask, u8 val) {
  switch (s.op_tick) {
    case 14:
      s.z = read_n();
      if (f_is(mask, val)) {
        s.pc += (s8)s.z;
      }
      break;
    case 22: op_done(); break;
  }
}